

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_DaggerAlert
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *emitter;
  AActor *target;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  char *pcVar5;
  bool bVar6;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      emitter = (AActor *)(param->field_0).field_1.a;
      if (emitter != (AActor *)0x0) {
        if ((emitter->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(emitter->super_DThinker).super_DObject._vptr_DObject)(emitter);
          (emitter->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
          uVar4 = extraout_RDX;
        }
        pPVar3 = (emitter->super_DThinker).super_DObject.Class;
        bVar6 = pPVar3 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar6);
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar6);
        defaultparam = (TArray<VMValue,_VMValue> *)
                       CONCAT71((int7)((ulong)defaultparam >> 8),pPVar3 == pPVar1 || bVar6);
        if (pPVar3 != pPVar1 && !bVar6) {
          do {
            pPVar3 = pPVar3->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar3 != (PClass *)0x0);
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f1978;
        }
      }
      pPVar1 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) {
        pcVar5 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          target = (AActor *)param[1].field_0.field_1.a;
          if (target != (AActor *)0x0) {
            if ((target->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar2 = (**(target->super_DThinker).super_DObject._vptr_DObject)
                                (target,defaultparam,uVar4,ret);
              (target->super_DThinker).super_DObject.Class =
                   (PClass *)CONCAT44(extraout_var_00,iVar2);
            }
            pPVar3 = (target->super_DThinker).super_DObject.Class;
            bVar6 = pPVar3 != (PClass *)0x0;
            if (pPVar3 != pPVar1 && bVar6) {
              do {
                pPVar3 = pPVar3->ParentClass;
                bVar6 = pPVar3 != (PClass *)0x0;
                if (pPVar3 == pPVar1) break;
              } while (pPVar3 != (PClass *)0x0);
            }
            if (!bVar6) {
              pcVar5 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_003f1997;
            }
          }
          P_DaggerAlert(target,emitter);
          return 0;
        }
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003f1997:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x14e,
                    "int AF_AActor_DaggerAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f1978:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x14d,
                "int AF_AActor_DaggerAlert(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DaggerAlert)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(target, AActor);
	// Note that the emitter is self, not the target of the alert! Target can be NULL.
	P_DaggerAlert(target, self);
	return 0;
}